

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O1

int parseInteger(char *str,int start,int len)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ushort **ppuVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  
  iVar6 = 0;
  if (-1 < start && str != (char *)0x0) {
    if (len < 1) {
      bVar3 = true;
      iVar8 = 0;
    }
    else {
      pcVar7 = str + (uint)start;
      iVar6 = len + 1;
      bVar2 = false;
      bVar3 = false;
      iVar8 = 0;
      while( true ) {
        cVar1 = *pcVar7;
        if ((long)cVar1 == 0) break;
        if ((byte)(cVar1 - 0x30U) < 10) {
          iVar8 = (uint)(byte)(cVar1 - 0x30U) + iVar8 * 10;
          bVar4 = true;
        }
        else if ((bVar2) || (bVar4 = true, cVar1 != '+')) {
          if ((bVar2) || (cVar1 != '-')) {
            ppuVar5 = __ctype_b_loc();
            if ((bVar2) || (bVar4 = false, ((*ppuVar5)[cVar1] & 0x2000) == 0)) break;
          }
          else {
            bVar3 = true;
            bVar4 = true;
          }
        }
        bVar2 = bVar4;
        pcVar7 = pcVar7 + 1;
        iVar6 = iVar6 + -1;
        if (iVar6 < 2) break;
      }
      bVar3 = !bVar3;
    }
    iVar6 = -iVar8;
    if (bVar3) {
      iVar6 = iVar8;
    }
  }
  return iVar6;
}

Assistant:

int parseInteger(char *str, int start, int len) {
   register int value = 0;
   register char ch;
   int neg = 0, inside = 0;

   if (!str || start < 0) { return 0; }
   str += start;

   while((len-- > 0) && *str) {
      ch = *str++;
      if ((ch >='0') && (ch <= '9')) {
	 value = (10*value) + (ch - '0');
	 inside = 1;
      }
      else if (ch == '+' && !inside) {
	 inside = 1;
      }
      else if (ch == '-' && !inside) {
	 neg = 1;
	 inside = 1;
      }
      else if (isspace(ch) && !inside) { /* nothing */ }
      else break; /* end of integer */
   }
   return (neg?-value:value);
}